

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::CompletionFlag::CompletionFlag<args::ArgumentParser>
          (CompletionFlag *this,ArgumentParser *group_,Matcher *matcher_)

{
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"completion","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"completion flag","");
  NamedBase::NamedBase((NamedBase *)this,&local_48,&local_68,Hidden);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__FlagBase_0021e5a8;
  Matcher::Matcher(&(this->super_ValueFlagBase).super_FlagBase.matcher,matcher_);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__FlagBase_0021eaa8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__CompletionFlag_002211d0;
  (this->reply).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reply).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reply).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->cword = 0;
  (this->syntax)._M_dataplus._M_p = (pointer)&(this->syntax).field_2;
  (this->syntax)._M_string_length = 0;
  (this->syntax).field_2._M_local_buf[0] = '\0';
  group_->completion = this;
  Group::Add((Group *)group_,(Base *)this);
  return;
}

Assistant:

CompletionFlag(GroupClass &group_, Matcher &&matcher_): ValueFlagBase("completion", "completion flag", std::move(matcher_), Options::Hidden)
            {
                group_.AddCompletion(*this);
            }